

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# limit_relation.cpp
# Opt level: O2

string * __thiscall
duckdb::LimitRelation::ToString_abi_cxx11_
          (string *__return_storage_ptr__,LimitRelation *this,idx_t depth)

{
  Relation *pRVar1;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  Relation::RenderWhitespace_abi_cxx11_(&local_80,(Relation *)depth,depth);
  ::std::operator+(&local_a0,&local_80,"Limit ");
  ::std::__cxx11::to_string(&local_40,this->limit);
  ::std::operator+(&local_60,&local_a0,&local_40);
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::__cxx11::string::~string((string *)&local_a0);
  ::std::__cxx11::string::~string((string *)&local_80);
  if (0 < this->offset) {
    ::std::__cxx11::to_string(&local_80,this->offset);
    ::std::operator+(&local_a0," Offset ",&local_80);
    ::std::__cxx11::string::append((string *)&local_60);
    ::std::__cxx11::string::~string((string *)&local_a0);
    ::std::__cxx11::string::~string((string *)&local_80);
  }
  ::std::__cxx11::string::append((char *)&local_60);
  pRVar1 = shared_ptr<duckdb::Relation,_true>::operator->(&this->child);
  (*pRVar1->_vptr_Relation[6])(&local_a0,pRVar1,depth + 1);
  ::std::operator+(__return_storage_ptr__,&local_60,&local_a0);
  ::std::__cxx11::string::~string((string *)&local_a0);
  ::std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

string LimitRelation::ToString(idx_t depth) {
	string str = RenderWhitespace(depth) + "Limit " + to_string(limit);
	if (offset > 0) {
		str += " Offset " + to_string(offset);
	}
	str += "\n";
	return str + child->ToString(depth + 1);
}